

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O0

void __thiscall Sound_Queue::~Sound_Queue(Sound_Queue *this)

{
  undefined8 *in_RDI;
  
  if ((*(byte *)((long)in_RDI + 0x1c) & 1) != 0) {
    SDL_PauseAudio(1);
    SDL_CloseAudio();
  }
  if (in_RDI[1] != 0) {
    SDL_DestroySemaphore(in_RDI[1]);
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  return;
}

Assistant:

Sound_Queue::~Sound_Queue()
{
	if ( sound_open )
	{
		SDL_PauseAudio( true );
		SDL_CloseAudio();
	}
	
	if ( free_sem )
		SDL_DestroySemaphore( free_sem );
	
	delete [] bufs;
}